

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

string * __thiscall
cfd::core::KeyData::GetBip32Path_abi_cxx11_
          (string *__return_storage_ptr__,KeyData *this,HardenedType hardened_type,bool has_hex)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  ostream *poVar4;
  pointer puVar5;
  char *pcVar6;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  puVar5 = (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = true;
  do {
    if (puVar5 == puVar2) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream(local_1b8);
      return __return_storage_ptr__;
    }
    uVar1 = *puVar5;
    if (!bVar3) {
      ::std::operator<<(local_1a8,"/");
    }
    poVar4 = local_1a8;
    if (has_hex) {
      poVar4 = ::std::operator<<(local_1a8,"0x");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    }
    ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    if ((int)uVar1 < 0) {
      pcVar6 = "H";
      if (hardened_type != kLargeH) {
        if (hardened_type == kNumber) goto LAB_001d3035;
        if (hardened_type == kSmallH) {
          pcVar6 = "h";
        }
        else {
          pcVar6 = "\'";
        }
      }
      ::std::operator<<(local_1a8,pcVar6);
    }
LAB_001d3035:
    puVar5 = puVar5 + 1;
    bVar3 = false;
  } while( true );
}

Assistant:

std::string KeyData::GetBip32Path(
    HardenedType hardened_type, bool has_hex) const {
  std::stringstream ss;
  bool is_first = true;
  for (auto child_num : path_) {
    if (!is_first) ss << "/";
    uint32_t num = (hardened_type == HardenedType::kNumber)
                       ? child_num
                       : (child_num & 0x7FFFFFFF);
    if (has_hex) {
      ss << "0x" << std::hex << num;
    } else {
      ss << num;
    }

    if (child_num & 0x80000000) {
      switch (hardened_type) {
        case kLargeH:
          ss << "H";
          break;
        case kSmallH:
          ss << "h";
          break;
        case kNumber:
          // do nothing
          break;
        case kApostrophe:
        default:
          ss << "'";
          break;
      }
    }
    is_first = false;
  }
  return ss.str();
}